

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O2

bool __thiscall BackwardPass::IsFormalParamSym(BackwardPass *this,Func *func,Sym *sym)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  ArgSlot AVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  PropertySym *pPVar7;
  JITTimeFunctionBody *this_00;
  StackSym *pSVar8;
  
  if (sym == (Sym *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x10b0,"(sym)","sym");
    if (!bVar3) goto LAB_003d1ce5;
    *puVar6 = 0;
  }
  if (sym->m_kind != SymKindStack) {
    if (sym->m_kind == SymKindProperty) {
      pPVar7 = Sym::AsPropertySym(sym);
      uVar1 = pPVar7->m_propertyId;
      BVar5 = Func::IsFormalsArraySym(func,(pPVar7->m_stackSym->super_Sym).m_id);
      if (-1 < (int)uVar1 && BVar5 != 0) {
        this_00 = Func::GetJITFunctionBody(func);
        AVar4 = JITTimeFunctionBody::GetInParamsCount(this_00);
        return (long)(ulong)uVar1 < (long)((ulong)AVar4 - 1);
      }
      return false;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x10bd,"(sym->IsStackSym())","sym->IsStackSym()");
    if (!bVar3) {
LAB_003d1ce5:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  pSVar8 = Sym::AsStackSym(sym);
  BVar5 = Func::IsFormalsArraySym(func,(pSVar8->super_Sym).m_id);
  return BVar5 != 0;
}

Assistant:

bool
BackwardPass::IsFormalParamSym(Func * func, Sym * sym) const
{
    Assert(sym);

    if (sym->IsPropertySym())
    {
        //If the sym is a propertySym, then see if the propertyId is within the range of the formals
        //We can have other properties stored in the scope object other than the formals (following the formals).
        PropertySym * propSym = sym->AsPropertySym();
        IntConstType    value = propSym->m_propertyId;
        return func->IsFormalsArraySym(propSym->m_stackSym->m_id) &&
            (value >= 0 && value < func->GetJITFunctionBody()->GetInParamsCount() - 1);
    }
    else
    {
        Assert(sym->IsStackSym());
        return !!func->IsFormalsArraySym(sym->AsStackSym()->m_id);
    }
}